

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::exceptions::no_such_option::~no_such_option(no_such_option *this)

{
  parsing::~parsing((parsing *)0x12d14e);
  return;
}

Assistant:

explicit no_such_option(const std::string& option)
  : parsing("Option " + LQUOTE + option + RQUOTE + " does not exist")
  {
  }